

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O0

void __thiscall libtorrent::utp_socket_impl::send_syn(utp_socket_impl *this)

{
  ushort uVar1;
  utp_socket_manager *this_00;
  bool bVar2;
  long lVar3;
  pointer ppVar4;
  pointer ppVar5;
  int64_t iVar6;
  bool local_109;
  unique_ptr<libtorrent::packet,_libtorrent::packet_deleter> local_c0;
  undefined1 local_b8 [24];
  error_code local_a0;
  error_code local_90;
  udp_send_flags_t local_7d;
  basic_endpoint<boost::asio::ip::udp> local_7c;
  weak_ptr<libtorrent::utp_socket_interface> local_60;
  undefined1 auStack_50 [8];
  error_code ec;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  time_point now;
  utp_header *h;
  packet_ptr p;
  utp_socket_impl *this_local;
  
  p._M_t.super___uniq_ptr_impl<libtorrent::packet,_libtorrent::packet_deleter>._M_t.
  super__Tuple_impl<0UL,_libtorrent::packet_*,_libtorrent::packet_deleter>.
  super__Head_base<0UL,_libtorrent::packet_*,_false>._M_head_impl =
       (__uniq_ptr_data<libtorrent::packet,_libtorrent::packet_deleter,_true,_true>)
       (__uniq_ptr_data<libtorrent::packet,_libtorrent::packet_deleter,_true,_true>)this;
  lVar3 = random((libtorrent *)0xffff);
  this->m_seq_nr = (uint16_t)lVar3;
  this->m_acked_seq_nr = this->m_seq_nr - 1;
  this->m_loss_seq_nr = this->m_acked_seq_nr;
  this->m_ack_nr = 0;
  this->m_fast_resend_seq_nr = this->m_seq_nr;
  acquire_packet((utp_socket_impl *)&h,(int)this);
  ppVar4 = std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>::operator->
                     ((unique_ptr<libtorrent::packet,_libtorrent::packet_deleter> *)&h);
  ppVar4->size = 0x14;
  ppVar4 = std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>::operator->
                     ((unique_ptr<libtorrent::packet,_libtorrent::packet_deleter> *)&h);
  ppVar4->header_size = 0x14;
  ppVar4 = std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>::operator->
                     ((unique_ptr<libtorrent::packet,_libtorrent::packet_deleter> *)&h);
  ppVar4->field_0xe = ppVar4->field_0xe & 0xc0;
  ppVar4 = std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>::operator->
                     ((unique_ptr<libtorrent::packet,_libtorrent::packet_deleter> *)&h);
  ppVar4->field_0xe = ppVar4->field_0xe & 0x7f;
  ppVar4 = std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>::operator->
                     ((unique_ptr<libtorrent::packet,_libtorrent::packet_deleter> *)&h);
  ppVar4->field_0xe = ppVar4->field_0xe & 0xbf;
  ppVar4 = std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>::operator->
                     ((unique_ptr<libtorrent::packet,_libtorrent::packet_deleter> *)&h);
  ppVar4->buf[0] = 'A';
  *(undefined1 *)&ppVar4[1].send_time.__d.__r = 0;
  big_endian_int<unsigned_short>::operator=
            ((big_endian_int<unsigned_short> *)((long)&ppVar4[1].send_time.__d.__r + 1),
             this->m_recv_id);
  big_endian_int<unsigned_int>::operator=
            ((big_endian_int<unsigned_int> *)((long)&ppVar4[1].send_time.__d.__r + 7),
             this->m_reply_micro);
  big_endian_int<unsigned_int>::operator=
            ((big_endian_int<unsigned_int> *)((long)&ppVar4[1].size + 1),0);
  big_endian_int<unsigned_short>::operator=
            ((big_endian_int<unsigned_short> *)ppVar4[1].buf,this->m_seq_nr);
  big_endian_int<unsigned_short>::operator=
            ((big_endian_int<unsigned_short> *)((long)&ppVar4[2].send_time.__d.__r + 1),0);
  local_38.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  ppVar5 = std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>::operator->
                     ((unique_ptr<libtorrent::packet,_libtorrent::packet_deleter> *)&h);
  (ppVar5->send_time).__d.__r = (rep)local_38.__d.__r;
  ec.cat_ = (error_category *)
            std::chrono::
            time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            ::time_since_epoch(&local_38);
  iVar6 = total_microseconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    ((duration<long,_std::ratio<1L,_1000000000L>_>)ec.cat_);
  big_endian_int<unsigned_int>::operator=
            ((big_endian_int<unsigned_int> *)((long)&ppVar4[1].send_time.__d.__r + 3),(uint)iVar6);
  boost::system::error_code::error_code((error_code *)auStack_50);
  this_00 = this->m_sm;
  std::weak_ptr<libtorrent::utp_socket_interface>::weak_ptr(&local_60,&this->m_sock);
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
            (&local_7c,&this->m_remote_address,this->m_port);
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::udp_send_flags_tag,_void>::
  bitfield_flag(&local_7d);
  utp_socket_manager::send_packet
            (this_00,&local_60,&local_7c,(char *)ppVar4->buf,0x14,(error_code *)auStack_50,local_7d)
  ;
  std::weak_ptr<libtorrent::utp_socket_interface>::~weak_ptr(&local_60);
  boost::system::error_code::error_code<boost::asio::error::basic_errors>
            (&local_90,try_again,(type *)0x0);
  bVar2 = boost::system::operator==((error_code *)auStack_50,&local_90);
  local_109 = true;
  if (!bVar2) {
    boost::system::error_code::error_code<boost::asio::error::basic_errors>
              (&local_a0,try_again,(type *)0x0);
    local_109 = boost::system::operator==((error_code *)auStack_50,&local_a0);
  }
  if (local_109 == false) {
    bVar2 = boost::system::error_code::operator_cast_to_bool((error_code *)auStack_50);
    if (bVar2) {
      std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>::unique_ptr
                ((unique_ptr<libtorrent::packet,_libtorrent::packet_deleter> *)(local_b8 + 0x10),
                 (unique_ptr<libtorrent::packet,_libtorrent::packet_deleter> *)&h);
      release_packet(this,(unique_ptr<libtorrent::packet,_libtorrent::packet_deleter> *)
                          (local_b8 + 0x10));
      std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>::~unique_ptr
                ((unique_ptr<libtorrent::packet,_libtorrent::packet_deleter> *)(local_b8 + 0x10));
      (this->m_error).val_ = auStack_50._0_4_;
      (this->m_error).failed_ = (bool)auStack_50[4];
      *(undefined3 *)&(this->m_error).field_0x5 = auStack_50._5_3_;
      (this->m_error).cat_ = (error_category *)ec._0_8_;
      set_state(this,4);
      test_socket_state(this);
      local_b8._12_4_ = 1;
      goto LAB_00618f90;
    }
  }
  else if ((*(ushort *)&this->field_0x21a >> 0xd & 1) == 0) {
    this->field_0x21b = this->field_0x21b | 0x20;
    utp_socket_manager::subscribe_writable(this->m_sm,this);
  }
  if ((*(ushort *)&this->field_0x21a >> 0xd & 1) == 0) {
    ppVar4 = std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>::operator->
                       ((unique_ptr<libtorrent::packet,_libtorrent::packet_deleter> *)&h);
    ppVar4->field_0xe = ppVar4->field_0xe & 0xc0 | (ppVar4->field_0xe & 0x3f) + 1 & 0x3f;
  }
  uVar1 = this->m_seq_nr;
  std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>::unique_ptr
            (&local_c0,(unique_ptr<libtorrent::packet,_libtorrent::packet_deleter> *)&h);
  packet_buffer::insert((packet_buffer *)local_b8,(int)this + 0xc0,(packet_ptr *)(ulong)uVar1);
  std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>::~unique_ptr
            ((unique_ptr<libtorrent::packet,_libtorrent::packet_deleter> *)local_b8);
  std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>::~unique_ptr(&local_c0);
  this->m_seq_nr = this->m_seq_nr + 1;
  set_state(this,1);
  local_b8._12_4_ = 0;
LAB_00618f90:
  std::unique_ptr<libtorrent::packet,_libtorrent::packet_deleter>::~unique_ptr
            ((unique_ptr<libtorrent::packet,_libtorrent::packet_deleter> *)&h);
  return;
}

Assistant:

void utp_socket_impl::send_syn()
{
	INVARIANT_CHECK;

	m_seq_nr = std::uint16_t(random(0xffff));
	m_acked_seq_nr = (m_seq_nr - 1) & ACK_MASK;
	m_loss_seq_nr = m_acked_seq_nr;
	m_ack_nr = 0;
	m_fast_resend_seq_nr = m_seq_nr;

	packet_ptr p = acquire_packet(sizeof(utp_header));
	p->size = sizeof(utp_header);
	p->header_size = sizeof(utp_header);
	p->num_transmissions = 0;
	p->mtu_probe = false;
#if TORRENT_USE_ASSERTS
	p->num_fast_resend = 0;
#endif
	p->need_resend = false;
	auto* h = reinterpret_cast<utp_header*>(p->buf);
	h->type_ver = (ST_SYN << 4) | 1;
	h->extension = utp_no_extension;
	// using recv_id here is intentional! This is an odd
	// thing in uTP. The syn packet is sent with the connection
	// ID that it expects to receive the syn ack on. All
	// subsequent connection IDs will be this plus one.
	h->connection_id = m_recv_id;
	h->timestamp_difference_microseconds = m_reply_micro;
	h->wnd_size = 0;
	h->seq_nr = m_seq_nr;
	h->ack_nr = 0;

	time_point const now = clock_type::now();
	p->send_time = now;
	h->timestamp_microseconds = std::uint32_t(
		total_microseconds(now.time_since_epoch()) & 0xffffffff);

#if TORRENT_UTP_LOG
	UTP_LOGV("%8p: send_syn seq_nr:%d id:%d target:%s\n"
		, static_cast<void*>(this), int(m_seq_nr), int(m_recv_id)
		, print_endpoint(udp::endpoint(m_remote_address, m_port)).c_str());
#endif

	error_code ec;
	m_sm.send_packet(m_sock, udp::endpoint(m_remote_address, m_port)
		, reinterpret_cast<char const*>(h) , sizeof(utp_header), ec);

	if (ec == error::would_block || ec == error::try_again)
	{
#if TORRENT_UTP_LOG
		UTP_LOGV("%8p: socket stalled\n", static_cast<void*>(this));
#endif
		if (!m_stalled)
		{
			m_stalled = true;
			m_sm.subscribe_writable(this);
		}
	}
	else if (ec)
	{
		release_packet(std::move(p));
		m_error = ec;
		set_state(UTP_STATE_ERROR_WAIT);
		test_socket_state();
		return;
	}

	if (!m_stalled)
		++p->num_transmissions;

	TORRENT_ASSERT(!m_outbuf.at(m_seq_nr));
	TORRENT_ASSERT(h->seq_nr == m_seq_nr);
	TORRENT_ASSERT(p->buf == reinterpret_cast<std::uint8_t*>(h));
	m_outbuf.insert(m_seq_nr, std::move(p));

	m_seq_nr = (m_seq_nr + 1) & ACK_MASK;

	TORRENT_ASSERT(!m_error);
	set_state(UTP_STATE_SYN_SENT);
#if TORRENT_UTP_LOG
	UTP_LOGV("%8p: state:%s\n", static_cast<void*>(this), socket_state_names[m_state]);
#endif
}